

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall
QMenuPrivate::ScrollerTearOffItem::paintEvent(ScrollerTearOffItem *this,QPaintEvent *e)

{
  Type type;
  int iVar1;
  QWidgetData *pQVar2;
  QMenuPrivate *this_00;
  QWidget *pQVar3;
  QWidget *this_01;
  QMenuScroller *pQVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  QStyle *pQVar9;
  Representation RVar10;
  long in_FS_OFFSET;
  QPainter p;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QWidget).data;
  uStack_40._0_4_ = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
  uStack_40._4_4_ = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
  local_48 = (undefined1 *)0x0;
  cVar5 = QRect::intersects((QRect *)(e + 0x10));
  if (cVar5 != '\0') {
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_50,&(this->super_QWidget).super_QPaintDevice);
    this_00 = this->menuPrivate;
    pQVar3 = *(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10);
    type = this->scrollType;
    pQVar2 = (this->super_QWidget).data;
    iVar7 = (pQVar2->crect).x2.m_i;
    this_01 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
    iVar1 = (pQVar2->crect).x1.m_i;
    pQVar9 = QWidget::style(this_01);
    iVar6 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x1b,0,this_01);
    local_48 = (undefined1 *)0x0;
    uStack_40._4_4_ = iVar6 + -1;
    uStack_40._0_4_ = iVar7 - iVar1;
    drawScroller(this_00,(QPainter *)&local_50,type,(QRect *)&local_48);
    if (this->scrollType == ScrollUp) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar2 = (this->super_QWidget).data;
      RVar10.m_i = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
      pQVar9 = QWidget::style(pQVar3);
      iVar7 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x1f,0,pQVar3);
      local_48 = (undefined1 *)0x0;
      uStack_40._4_4_ = iVar7 + -1;
      uStack_40._0_4_ = RVar10.m_i;
      pQVar4 = this->menuPrivate->scroll;
      if ((pQVar4 != (QMenuScroller *)0x0) && ((pQVar4->scrollFlags & 1) != 0)) {
        pQVar3 = *(QWidget **)&(this->menuPrivate->super_QWidgetPrivate).field_0x8;
        pQVar9 = QWidget::style(pQVar3);
        uVar8 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,0x1b,0,pQVar3);
        local_48 = (undefined1 *)((ulong)uVar8 << 0x20);
        uStack_40._4_4_ = iVar7 + -1 + uVar8;
      }
      drawTearOff(this->menuPrivate,(QPainter *)&local_50,(QRect *)&local_48);
    }
    QPainter::~QPainter((QPainter *)&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::ScrollerTearOffItem::paintEvent(QPaintEvent *e)
{
    if (!e->rect().intersects(rect()))
        return;

    QPainter p(this);
    QWidget *parent = parentWidget();

    //paint scroll up / down arrows
    menuPrivate->drawScroller(&p, scrollType, QRect(0, 0, width(), menuPrivate->scrollerHeight()));
    //paint the tear off
    if (scrollType == QMenuPrivate::ScrollerTearOffItem::ScrollUp) {
        QRect rect(0, 0, width(), parent->style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, parent));
        if (menuPrivate->scroll && menuPrivate->scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
            rect.translate(0, menuPrivate->scrollerHeight());
        menuPrivate->drawTearOff(&p, rect);
    }
}